

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# deSocket.cpp
# Opt level: O2

void __thiscall de::Socket::shutdownReceive(Socket *this)

{
  SocketError *this_00;
  deBool dVar1;
  allocator<char> local_39;
  string local_38;
  
  dVar1 = deSocket_shutdown(this->m_socket,1);
  if (dVar1 != 0) {
    return;
  }
  this_00 = (SocketError *)__cxa_allocate_exception(0x10);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_38,"Socket receive channel shutdown failed",&local_39);
  SocketError::SocketError(this_00,&local_38);
  __cxa_throw(this_00,&SocketError::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

void Socket::shutdownReceive (void)
{
	if (!deSocket_shutdown(m_socket, DE_SOCKETCHANNEL_RECEIVE))
		throw SocketError("Socket receive channel shutdown failed");
}